

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping_padding.cpp
# Opt level: O0

void test_2d_static<5ul,5ul,1ul,0ul,30ul,30ul>(void)

{
  ulong uVar1;
  value_type vVar2;
  value_type vVar3;
  size_type sVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  size_type sVar9;
  long lVar10;
  bool bVar11;
  int local_1034 [2];
  dimensions<5UL,_5UL> local_102b [2];
  dimensions<5UL,_5UL> local_1029;
  int local_1028;
  dimensions<1UL,_0UL> local_1021;
  int local_1020;
  dimensions<1UL,_0UL> local_1019;
  int *local_1018;
  int *local_1010;
  size_type local_1008;
  dimensions<1UL,_0UL> local_ff9;
  unsigned_long local_ff8;
  size_t true_idx_3;
  int local_fe8;
  dimensions<1UL,_0UL> local_fe1;
  int i_3;
  int local_fdc;
  int j_3;
  int *local_fd0;
  size_type local_fc8;
  unsigned_long local_fc0;
  size_t true_idx_2;
  int local_fb0;
  dimensions<5UL,_5UL> s;
  int iStack_fac;
  dimensions<1UL,_0UL> p;
  int i_2;
  int j_2;
  int local_fa0;
  dimensions<1UL,_0UL> local_f99;
  int *local_f98;
  int *local_f90;
  size_type local_f88;
  dimensions<1UL,_0UL> local_f79;
  unsigned_long local_f78;
  size_t true_idx_1;
  int local_f68;
  dimensions<1UL,_0UL> local_f61;
  int i_1;
  int local_f5c;
  int j_1;
  int *local_f50;
  size_type local_f48;
  dimensions<1UL,_0UL> local_f39;
  unsigned_long local_f38;
  size_t true_idx;
  int i;
  int j;
  int dptr [930];
  unsigned_long local_98;
  size_type local_90;
  unsigned_long local_88;
  size_type local_80;
  unsigned_long local_78;
  size_type local_70;
  unsigned_long local_68;
  size_type local_60;
  bool local_55;
  bool local_54;
  layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
  local_53;
  unsigned_long uStack_50;
  layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
  sub_l;
  size_type local_48;
  unsigned_long local_40;
  size_type local_38;
  int local_2c;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_d;
  bool local_c;
  layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
  local_b [2];
  layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
  l;
  
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
  ::layout_mapping_right(local_b);
  local_c = std::experimental::
            layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
            ::is_regular();
  local_d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x26,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_c,&local_d);
  local_18 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
             ::stride(local_b,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x28,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_18,&local_1c);
  local_28 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
             ::stride(local_b,1);
  local_2c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x29,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_28,&local_2c);
  local_38 = std::experimental::dimensions<30UL,_30UL>::size((dimensions<30UL,_30UL> *)local_b);
  local_40 = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x2b,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_38,&local_40);
  local_48 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
             ::span(local_b);
  uStack_50 = 0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x2c,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_48,&stack0xffffffffffffffb0);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
  ::layout_mapping_right(&local_53);
  local_54 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
             ::is_regular();
  local_55 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x34,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_54,&local_55);
  local_60 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
             ::stride(&local_53,0);
  local_68 = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x36,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_60,&local_68);
  local_70 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
             ::stride(&local_53,1);
  local_78 = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x37,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_70,&local_78);
  local_80 = std::experimental::dimensions<6UL,_6UL>::size((dimensions<6UL,_6UL> *)&local_53);
  local_88 = 0x24;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x39,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_80,&local_88);
  local_90 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
             ::span(&local_53);
  local_98 = 0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x3a,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,&local_90,&local_98);
  for (true_idx._4_4_ = 0; uVar1 = (ulong)true_idx._4_4_,
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,1), uVar1 < vVar2;
      true_idx._4_4_ = true_idx._4_4_ + 1) {
    for (true_idx._0_4_ = 0; uVar1 = (ulong)(int)true_idx,
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,0), uVar1 < vVar2;
        true_idx._0_4_ = (int)true_idx + 1) {
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>(&local_f39,1);
      local_f38 = (vVar2 + vVar3) * (long)(int)true_idx + (long)true_idx._4_4_;
      local_f48 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                    *)local_b,(int)true_idx,true_idx._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x44,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_f48,&local_f38);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      local_f50 = &i + sVar4;
      _j_1 = &i + local_f38;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x46,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_f50,(int **)&j_1);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      (&i)[sVar4] = 0x2a;
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      local_f5c = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x4a,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&i + sVar4,&local_f5c);
    }
  }
  i_1 = 0;
  while( true ) {
    uVar1 = (ulong)i_1;
    vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                      ((dimensions<30UL,_30UL> *)local_b,1);
    std::experimental::
    layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
    ::padding(local_b);
    vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>(&local_f61,1);
    if (vVar2 + vVar3 <= uVar1) break;
    local_f68 = 0;
    while( true ) {
      uVar1 = (ulong)local_f68;
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,0);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>
                        ((dimensions<1UL,_0UL> *)((long)&true_idx_1 + 7),0);
      if (vVar2 + vVar3 <= uVar1) break;
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>(&local_f79,1);
      local_f78 = (vVar2 + vVar3) * (long)local_f68 + (long)i_1;
      local_f88 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                    *)local_b,local_f68,i_1);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x53,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_f88,&local_f78);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                *)local_b,local_f68,i_1);
      local_f90 = &i + sVar4;
      local_f98 = &i + local_f78;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x55,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_f90,&local_f98);
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,0);
      bVar11 = false;
      if (vVar2 <= (ulong)(long)local_f68) {
        uVar1 = (ulong)local_f68;
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,0);
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
        ::padding(local_b);
        vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>(&local_f99,0);
        bVar11 = uVar1 < vVar2 + vVar3;
      }
      if (bVar11) {
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                  *)local_b,local_f68,i_1);
        (&i)[sVar4] = 0x11;
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                  *)local_b,local_f68,i_1);
        local_fa0 = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x5c,
                   "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,&i + sVar4,&local_fa0);
      }
      else {
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,1);
        bVar11 = false;
        if (vVar2 <= (ulong)(long)i_1) {
          uVar1 = (ulong)i_1;
          vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                            ((dimensions<30UL,_30UL> *)local_b,1);
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
          ::padding(local_b);
          vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>
                            ((dimensions<1UL,_0UL> *)((long)&j_2 + 3),1);
          bVar11 = uVar1 < vVar2 + vVar3;
        }
        if (bVar11) {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                    *)local_b,local_f68,i_1);
          (&i)[sVar4] = 0x18;
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                    *)local_b,local_f68,i_1);
          i_2 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                     ,100,
                     "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                     ,&i + sVar4,&i_2);
        }
      }
      local_f68 = local_f68 + 1;
    }
    i_1 = i_1 + 1;
  }
  for (iStack_fac = 0; uVar1 = (ulong)iStack_fac,
      vVar5 = std::experimental::dimensions<6UL,_6UL>::operator[]<int>
                        ((dimensions<6UL,_6UL> *)&local_53,1), uVar1 < vVar5;
      iStack_fac = iStack_fac + 1) {
    for (local_fb0 = 0; uVar1 = (ulong)local_fb0,
        vVar5 = std::experimental::dimensions<6UL,_6UL>::operator[]<int>
                          ((dimensions<6UL,_6UL> *)&local_53,0), uVar1 < vVar5;
        local_fb0 = local_fb0 + 1) {
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
      ::padding(local_b);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
      ::stepping(&local_53);
      vVar5 = std::experimental::dimensions<6UL,_6UL>::operator[]<int>
                        ((dimensions<6UL,_6UL> *)&local_53,1);
      vVar6 = std::experimental::dimensions<5UL,_5UL>::operator[]<int>
                        ((dimensions<5UL,_5UL> *)((long)&true_idx_2 + 5),1);
      vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>
                        ((dimensions<1UL,_0UL> *)((long)&true_idx_2 + 7),1);
      vVar7 = std::experimental::dimensions<5UL,_5UL>::operator[]<int>
                        ((dimensions<5UL,_5UL> *)((long)&true_idx_2 + 5),0);
      lVar10 = (long)local_fb0;
      vVar8 = std::experimental::dimensions<5UL,_5UL>::operator[]<int>
                        ((dimensions<5UL,_5UL> *)((long)&true_idx_2 + 5),1);
      local_fc0 = (vVar5 * vVar6 + vVar3) * vVar7 * lVar10 + vVar8 * (long)iStack_fac;
      local_fc8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<6ul,6ul>,std::experimental::dimensions<5ul,5ul>,std::experimental::dimensions<1ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<6ul,6ul>,std::experimental::dimensions<5ul,5ul>,std::experimental::dimensions<1ul,0ul>>
                                    *)&local_53,local_fb0,iStack_fac);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x70,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_fc8,&local_fc0);
      sVar9 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<6ul,6ul>,std::experimental::dimensions<5ul,5ul>,std::experimental::dimensions<1ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<6ul,6ul>,std::experimental::dimensions<5ul,5ul>,std::experimental::dimensions<1ul,0ul>>
                                *)&local_53,local_fb0,iStack_fac);
      local_fd0 = &i + sVar9;
      _j_3 = &i + local_fc0;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x72,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_fd0,(int **)&j_3);
      sVar9 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<6ul,6ul>,std::experimental::dimensions<5ul,5ul>,std::experimental::dimensions<1ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<6ul,6ul>,std::experimental::dimensions<5ul,5ul>,std::experimental::dimensions<1ul,0ul>>
                                *)&local_53,local_fb0,iStack_fac);
      (&i)[sVar9] = 0x47;
      sVar9 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<6ul,6ul>,std::experimental::dimensions<5ul,5ul>,std::experimental::dimensions<1ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<6ul,6ul>,std::experimental::dimensions<5ul,5ul>,std::experimental::dimensions<1ul,0ul>>
                                *)&local_53,local_fb0,iStack_fac);
      local_fdc = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x76,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&i + sVar9,&local_fdc);
    }
  }
  i_3 = 0;
  while( true ) {
    uVar1 = (ulong)i_3;
    vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                      ((dimensions<30UL,_30UL> *)local_b,1);
    std::experimental::
    layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
    ::padding(local_b);
    vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>(&local_fe1,1);
    if (vVar2 + vVar3 <= uVar1) break;
    local_fe8 = 0;
    while( true ) {
      uVar1 = (ulong)local_fe8;
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,0);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>
                        ((dimensions<1UL,_0UL> *)((long)&true_idx_3 + 7),0);
      if (vVar2 + vVar3 <= uVar1) break;
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>(&local_ff9,1);
      local_ff8 = (vVar2 + vVar3) * (long)local_fe8 + (long)i_3;
      local_1008 = std::experimental::
                   layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                   ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                     *)local_b,local_fe8,i_3);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x7f,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_1008,&local_ff8);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                *)local_b,local_fe8,i_3);
      local_1010 = &i + sVar4;
      local_1018 = &i + local_ff8;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x81,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,&local_1010,&local_1018);
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,0);
      bVar11 = false;
      if (vVar2 <= (ulong)(long)local_fe8) {
        uVar1 = (ulong)local_fe8;
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,0);
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
        ::padding(local_b);
        vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>(&local_1019,0);
        bVar11 = uVar1 < vVar2 + vVar3;
      }
      if (bVar11) {
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                  *)local_b,local_fe8,i_3);
        local_1020 = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                   ,0x86,
                   "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                   ,&i + sVar4,&local_1020);
      }
      else {
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,1);
        bVar11 = false;
        if (vVar2 <= (ulong)(long)i_3) {
          uVar1 = (ulong)i_3;
          vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                            ((dimensions<30UL,_30UL> *)local_b,1);
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_0UL>_>
          ::padding(local_b);
          vVar3 = std::experimental::dimensions<1UL,_0UL>::operator[]<int>(&local_1021,1);
          bVar11 = uVar1 < vVar2 + vVar3;
        }
        if (bVar11) {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                    *)local_b,local_fe8,i_3);
          local_1028 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                     ,0x8c,
                     "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                     ,&i + sVar4,&local_1028);
        }
        else {
          uVar1 = (ulong)local_fe8;
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
          ::stepping(&local_53);
          vVar6 = std::experimental::dimensions<5UL,_5UL>::operator[]<int>(&local_1029,0);
          bVar11 = false;
          if (uVar1 % vVar6 == 0) {
            uVar1 = (ulong)i_3;
            std::experimental::
            layout_mapping_right<std::experimental::dimensions<6UL,_6UL>,_std::experimental::dimensions<5UL,_5UL>,_std::experimental::dimensions<1UL,_0UL>_>
            ::stepping(&local_53);
            vVar6 = std::experimental::dimensions<5UL,_5UL>::operator[]<int>(local_102b,1);
            bVar11 = uVar1 % vVar6 == 0;
          }
          if (bVar11) {
            sVar4 = std::experimental::
                    layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                    ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                      *)local_b,local_fe8,i_3);
            local_1034[1] = 0x47;
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])","71",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                       ,0x97,
                       "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                       ,&i + sVar4,local_1034 + 1);
          }
          else {
            sVar4 = std::experimental::
                    layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                    ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,0ul>>
                                      *)local_b,local_fe8,i_3);
            local_1034[0] = 0x2a;
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])","42",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                       ,0x9c,
                       "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                       ,&i + sVar4,local_1034);
          }
        }
      }
      local_fe8 = local_fe8 + 1;
    }
    i_3 = i_3 + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % StepX), "X must be divisable by StepX");
    static_assert(0 == (Y % StepY), "Y must be divisable by StepY");

    layout_mapping_right<
        dimensions<X, Y>
      , dimensions<1, 1>
      , dimensions<PadX, PadY>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_right<
        dimensions<X / StepX, Y / StepY>
      , dimensions<StepX, StepY>
      , dimensions<PadX, PadY>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    int dptr[(X + PadX) * (Y + PadY)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.padding();
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1] + p[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.stepping()[0]))
               && (0 == (j % sub_l.stepping()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
            }
        }
    }
}